

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlistwidget.cpp
# Opt level: O2

bool __thiscall QListModel::clearItemData(QListModel *this,QModelIndex *index)

{
  QWidgetItemData *pQVar1;
  QListWidgetItemPrivate *pQVar2;
  char cVar3;
  long lVar4;
  long lVar5;
  QWidgetItemData *pQVar6;
  QWidgetItemData *pQVar7;
  long in_FS_OFFSET;
  QArrayDataPointer<int> local_48;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  cVar3 = QAbstractItemModel::checkIndex(this,index,1);
  if (cVar3 == '\0') goto LAB_0051fc67;
  pQVar2 = (this->items).d.ptr[index->r]->d;
  pQVar7 = (pQVar2->values).d.ptr;
  lVar5 = (pQVar2->values).d.size;
  lVar4 = lVar5 * 0x28;
  pQVar1 = pQVar7 + lVar5;
  pQVar7 = pQVar7 + 2;
  for (lVar5 = lVar5 >> 2; 0 < lVar5; lVar5 = lVar5 + -1) {
    if (3 < *(ulong *)&pQVar7[-2].value.d.field_0x18) {
      pQVar6 = pQVar7 + -2;
      goto LAB_0051fc33;
    }
    if (3 < *(ulong *)&pQVar7[-1].value.d.field_0x18) {
      pQVar6 = pQVar7 + -1;
      goto LAB_0051fc33;
    }
    pQVar6 = pQVar7;
    if (3 < *(ulong *)&(pQVar7->value).d.field_0x18) goto LAB_0051fc33;
    if (3 < *(ulong *)&pQVar7[1].value.d.field_0x18) {
      pQVar6 = pQVar7 + 1;
      goto LAB_0051fc33;
    }
    pQVar7 = pQVar7 + 4;
    lVar4 = lVar4 + -0xa0;
  }
  lVar4 = lVar4 / 0x28;
  pQVar6 = pQVar7 + -2;
  if (lVar4 == 1) {
LAB_0051fc9e:
    if (*(ulong *)&(pQVar6->value).d.field_0x18 < 4) {
      pQVar6 = pQVar1;
    }
  }
  else if (lVar4 == 3) {
    if (*(ulong *)&pQVar7[-2].value.d.field_0x18 < 4) {
      pQVar6 = pQVar7 + -1;
      goto LAB_0051fc93;
    }
  }
  else {
    if (lVar4 != 2) goto LAB_0051fc67;
LAB_0051fc93:
    if (*(ulong *)&(pQVar6->value).d.field_0x18 < 4) {
      pQVar6 = pQVar6 + 1;
      goto LAB_0051fc9e;
    }
  }
LAB_0051fc33:
  if (pQVar6 != pQVar1) {
    QList<QWidgetItemData>::clear(&pQVar2->values);
    local_48.d = (Data *)0x0;
    local_48.ptr = (int *)0x0;
    local_48.size = 0;
    QAbstractItemModel::dataChanged((QModelIndex *)this,index,(QList_conflict *)index);
    QArrayDataPointer<int>::~QArrayDataPointer(&local_48);
  }
LAB_0051fc67:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_28) {
    __stack_chk_fail();
  }
  return (bool)cVar3;
}

Assistant:

bool QListModel::clearItemData(const QModelIndex &index)
{
    if (!checkIndex(index, CheckIndexOption::IndexIsValid))
        return false;
    QListWidgetItem *item = items.at(index.row());
    const auto beginIter = item->d->values.cbegin();
    const auto endIter = item->d->values.cend();
    if (std::all_of(beginIter, endIter, [](const QWidgetItemData& data) -> bool { return !data.value.isValid(); }))
        return true; //it's already cleared
    item->d->values.clear();
    emit dataChanged(index, index, QList<int> {});
    return true;
}